

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImStb::STB_TEXTEDIT_DELETECHARS(ImGuiInputTextState *obj,int pos,int n)

{
  short sVar1;
  unsigned_short *puVar2;
  unsigned_short *puVar3;
  int iVar4;
  long lVar5;
  
  puVar2 = (obj->TextW).Data;
  iVar4 = ImTextCountUtf8BytesFromStr(puVar2 + pos,puVar2 + pos + n);
  obj->CurLenA = obj->CurLenA - iVar4;
  obj->CurLenW = obj->CurLenW - n;
  puVar3 = (obj->TextW).Data;
  for (lVar5 = (long)pos * 2; sVar1 = *(short *)((long)puVar3 + lVar5 + (long)n * 2), sVar1 != 0;
      lVar5 = lVar5 + 2) {
    *(short *)((long)puVar2 + lVar5) = sVar1;
  }
  *(undefined2 *)((long)puVar2 + lVar5) = 0;
  return;
}

Assistant:

static void STB_TEXTEDIT_DELETECHARS(STB_TEXTEDIT_STRING* obj, int pos, int n)
{
    ImWchar* dst = obj->TextW.Data + pos;

    // We maintain our buffer length in both UTF-8 and wchar formats
    obj->CurLenA -= ImTextCountUtf8BytesFromStr(dst, dst + n);
    obj->CurLenW -= n;

    // Offset remaining text (FIXME-OPT: Use memmove)
    const ImWchar* src = obj->TextW.Data + pos + n;
    while (ImWchar c = *src++)
        *dst++ = c;
    *dst = '\0';
}